

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall wabt::interp::Thread::DoMemoryFill(Thread *this,Instr instr,Ptr *out_trap)

{
  bool bVar1;
  pointer puVar2;
  Store *this_00;
  Memory *pMVar3;
  ulong uVar4;
  ulong uVar5;
  RunResult RVar6;
  ulong __n;
  Value VVar7;
  Value VVar8;
  RefPtr<wabt::interp::Memory> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_80,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  pMVar3 = local_80.obj_;
  bVar1 = ((local_80.obj_)->type_).limits.is_64;
  VVar7 = Pop(this);
  __n = (ulong)VVar7.field_0.i32_;
  if (bVar1 != false) {
    __n = VVar7.field_0.i64_;
  }
  VVar7 = Pop(this);
  bVar1 = (pMVar3->type_).limits.is_64;
  VVar8 = Pop(this);
  uVar5 = (ulong)VVar8.field_0.i32_;
  if (bVar1 != false) {
    uVar5 = VVar8.field_0.i64_;
  }
  puVar2 = (pMVar3->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar4 = (long)(pMVar3->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  if (((uVar4 < uVar5 + __n) || (uVar4 < __n)) || (uVar4 < uVar5)) {
    this_00 = this->store_;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"out of bounds memory access: memory.fill out of bounds","");
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,this_00,this_00,&local_68,&this->frames_);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    RVar6 = Trap;
  }
  else {
    RVar6 = Ok;
    if (__n != 0) {
      memset(puVar2 + uVar5,VVar7.field_0.i32_ & 0xff,__n);
      RVar6 = Ok;
    }
  }
  if (local_80.obj_ != (Memory *)0x0) {
    Store::DeleteRoot(local_80.store_,local_80.root_index_);
  }
  return RVar6;
}

Assistant:

RunResult Thread::DoMemoryFill(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32]};
  u64 size = PopPtr(memory);
  auto value = Pop<u32>();
  u64 dst = PopPtr(memory);
  TRAP_IF(Failed(memory->Fill(dst, value, size)),
          "out of bounds memory access: memory.fill out of bounds");
  return RunResult::Ok;
}